

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util_test.cc
# Opt level: O0

void __thiscall
google::protobuf::util::anon_unknown_0::DescriptorPoolTypeResolverSyntaxTest_SyntaxProto3_Test::
~DescriptorPoolTypeResolverSyntaxTest_SyntaxProto3_Test
          (DescriptorPoolTypeResolverSyntaxTest_SyntaxProto3_Test *this)

{
  DescriptorPoolTypeResolverSyntaxTest_SyntaxProto3_Test *this_local;
  
  ~DescriptorPoolTypeResolverSyntaxTest_SyntaxProto3_Test(this);
  operator_delete(this,0x90);
  return;
}

Assistant:

TEST_F(DescriptorPoolTypeResolverSyntaxTest, SyntaxProto3) {
  BuildFile(R"pb(
    package: "test"
    name: "foo"
    syntax: "proto3"
    message_type { name: "MyMessage" }
  )pb");

  Type type;
  ASSERT_TRUE(
      resolver_->ResolveMessageType(GetTypeUrl("test.MyMessage"), &type).ok());
  EXPECT_EQ(type.syntax(), Syntax::SYNTAX_PROTO3);
  EXPECT_EQ(type.edition(), "");
}